

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestBaseAndMaxLevels::initProgram(TextureViewTestBaseAndMaxLevels *this)

{
  GLuint GVar1;
  deUint32 dVar2;
  GLint GVar3;
  RenderContext *pRVar4;
  GLuint extraout_var;
  TestLog *this_00;
  MessageBuilder *this_01;
  TestError *pTVar5;
  int local_1c0 [2];
  GLint link_status;
  MessageBuilder local_1b0;
  int local_30;
  uint local_2c;
  GLint compile_status;
  GLint so_id;
  uint n_so_id;
  uint n_so_ids;
  GLuint so_ids [2];
  Functions *gl;
  TextureViewTestBaseAndMaxLevels *this_local;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  so_ids[0] = (*pRVar4->_vptr_RenderContext[3])();
  so_ids[1] = extraout_var;
  GVar1 = (**(code **)((long)so_ids + 0x3f0))(0x8b30);
  this->m_fs_id = GVar1;
  GVar1 = (**(code **)((long)so_ids + 0x3f0))(0x8b31);
  this->m_vs_id = GVar1;
  dVar2 = (**(code **)((long)so_ids + 0x800))();
  glu::checkError(dVar2,"glCreateShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x24e1);
  GVar1 = (**(code **)((long)so_ids + 0x3c8))();
  this->m_po_id = GVar1;
  dVar2 = (**(code **)((long)so_ids + 0x800))();
  glu::checkError(dVar2,"glCreateProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x24e6);
  (**(code **)((long)so_ids + 0x12b8))(this->m_vs_id,1,&initProgram::vs_body,0);
  dVar2 = (**(code **)((long)so_ids + 0x800))();
  glu::checkError(dVar2,"glShaderSource() call failed for vertex shader case",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x24fa);
  (**(code **)((long)so_ids + 0x12b8))(this->m_fs_id,1,&initProgram::fs_body,0);
  dVar2 = (**(code **)((long)so_ids + 0x800))();
  glu::checkError(dVar2,"glShaderSource() call failed for fragment shader case",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x250c);
  n_so_id = this->m_fs_id;
  n_so_ids = this->m_vs_id;
  so_id = 2;
  for (compile_status = 0; (uint)compile_status < 2; compile_status = compile_status + 1) {
    local_2c = (&n_so_id)[(uint)compile_status];
    (**(code **)((long)so_ids + 0x248))(local_2c);
    dVar2 = (**(code **)((long)so_ids + 0x800))();
    glu::checkError(dVar2,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2517);
    local_30 = 0;
    (**(code **)((long)so_ids + 0xa70))(local_2c,0x8b81,&local_30);
    dVar2 = (**(code **)((long)so_ids + 0x800))();
    glu::checkError(dVar2,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x251d);
    if (local_30 != 1) {
      this_00 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      this_01 = tcu::MessageBuilder::operator<<
                          (&local_1b0,(char (*) [26])"Shader compilation failed");
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    }
  }
  (**(code **)((long)so_ids + 0x10))(this->m_po_id,this->m_fs_id);
  (**(code **)((long)so_ids + 0x10))(this->m_po_id,this->m_vs_id);
  dVar2 = (**(code **)((long)so_ids + 0x800))();
  glu::checkError(dVar2,"glAttachShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2528);
  (**(code **)((long)so_ids + 0xce8))(this->m_po_id);
  dVar2 = (**(code **)((long)so_ids + 0x800))();
  glu::checkError(dVar2,"glLinkProgram() call faikled",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x252c);
  local_1c0[0] = 0;
  (**(code **)((long)so_ids + 0x9d8))(this->m_po_id,0x8b82,local_1c0);
  dVar2 = (**(code **)((long)so_ids + 0x800))();
  glu::checkError(dVar2,"glGetProgramiv() failed for GL_LINK_STATUS pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2532);
  if (local_1c0[0] != 1) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Program linking failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x2536);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  GVar3 = (**(code **)((long)so_ids + 0xb48))(this->m_po_id,"lod_index");
  this->m_po_lod_index_uniform_location = GVar3;
  GVar3 = (**(code **)((long)so_ids + 0xb48))(this->m_po_id,"to_sampler");
  this->m_po_to_sampler_uniform_location = GVar3;
  if (this->m_po_lod_index_uniform_location == -1) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"lod_index is considered an inactive uniform",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x253f);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (this->m_po_to_sampler_uniform_location == -1) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"to_sampler is considered an inactive uniform",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x2544);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void TextureViewTestBaseAndMaxLevels::initProgram()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate shader object IDs */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed");

	/* Generate program object ID */
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed");

	/* Set up vertex shader body */
	static const char* vs_body =
		"#version 400\n"
		"\n"
		"out vec2 uv;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    switch (gl_VertexID)\n"
		"    {\n"
		"        case 0: gl_Position = vec4(-1.0,  1.0, 0.0, 1.0); uv = vec2(0.0, 1.0); break;\n"
		"        case 1: gl_Position = vec4(-1.0, -1.0, 0.0, 1.0); uv = vec2(0.0, 0.0); break;\n"
		"        case 2: gl_Position = vec4( 1.0,  1.0, 0.0, 1.0); uv = vec2(1.0, 1.0); break;\n"
		"        case 3: gl_Position = vec4( 1.0, -1.0, 0.0, 1.0); uv = vec2(1.0, 0.0); break;\n"
		"    };\n"
		"}\n";

	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for vertex shader case");

	/* Set up fragment shader body */
	static const char* fs_body = "#version 400\n"
								 "\n"
								 "in vec2 uv;\n"
								 "\n"
								 "uniform int       lod_index;\n"
								 "uniform sampler2D to_sampler;\n"
								 "\n"
								 "out vec4 result;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    result = textureLod(to_sampler, uv, float(lod_index) );\n"
								 "}\n";

	gl.shaderSource(m_fs_id, 1 /* count */, &fs_body, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for fragment shader case");

	/* Compile both shaders */
	const glw::GLuint  so_ids[] = { m_fs_id, m_vs_id };
	const unsigned int n_so_ids = sizeof(so_ids) / sizeof(so_ids[0]);

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		glw::GLint so_id = so_ids[n_so_id];

		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		/* Make sure the compilation has succeeded */
		glw::GLint compile_status = GL_FALSE;

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status != GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Shader compilation failed" << tcu::TestLog::EndMessage;
		}
	} /* for (all shader objects) */

	/* Attach the shaders to the program object */
	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed");

	/* Link the program object */
	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call faikled");

	/* Verify the linking has succeeded */
	glw::GLint link_status = GL_FALSE;

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed for GL_LINK_STATUS pname");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* Retrieve uniform locations */
	m_po_lod_index_uniform_location  = gl.getUniformLocation(m_po_id, "lod_index");
	m_po_to_sampler_uniform_location = gl.getUniformLocation(m_po_id, "to_sampler");

	if (m_po_lod_index_uniform_location == -1)
	{
		TCU_FAIL("lod_index is considered an inactive uniform");
	}

	if (m_po_to_sampler_uniform_location == -1)
	{
		TCU_FAIL("to_sampler is considered an inactive uniform");
	}
}